

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [8];
  Scene *pSVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar46 [32];
  undefined1 auVar50 [16];
  float fVar49;
  float fVar60;
  float fVar62;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar58 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar61;
  undefined1 auVar59 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar63;
  float fVar74;
  float fVar75;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  float fVar79;
  float fVar92;
  float fVar93;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar100 [16];
  float fVar95;
  float fVar108;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar96;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar109;
  undefined1 auVar103 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar136;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar134;
  float fVar135;
  undefined1 auVar133 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [64];
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [64];
  float fVar156;
  undefined1 auVar157 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar158 [64];
  float fVar162;
  undefined1 auVar163 [16];
  float fVar168;
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar165 [64];
  float fVar169;
  float fVar174;
  undefined1 auVar170 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  undefined1 auVar171 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_15a9;
  undefined1 local_15a8 [16];
  float local_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  undefined8 local_1588;
  float fStack_1580;
  float fStack_157c;
  Ray *local_1578;
  int local_156c;
  undefined8 local_1568;
  float fStack_1560;
  float fStack_155c;
  undefined1 local_1558 [8];
  float fStack_1550;
  float fStack_154c;
  undefined1 local_1548 [8];
  float fStack_1540;
  float fStack_153c;
  undefined1 local_1538 [8];
  float fStack_1530;
  float fStack_152c;
  Scene *local_1528;
  RayQueryContext *local_1520;
  undefined1 local_1518 [8];
  float fStack_1510;
  float fStack_150c;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [8];
  float fStack_14e0;
  float fStack_14dc;
  long local_14d8;
  ulong local_14d0;
  ulong *local_14c8;
  long local_14c0;
  uint local_14b8;
  uint local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  uint local_14a0;
  uint local_149c;
  uint local_1498;
  RTCFilterFunctionNArguments local_1488;
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar147 = ray->tfar;
    auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar147) {
      local_14c8 = local_11d0;
      aVar5 = (ray->dir).field_0;
      auVar50 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx((undefined1  [16])aVar5,auVar39);
      auVar97._8_4_ = 0x219392ef;
      auVar97._0_8_ = 0x219392ef219392ef;
      auVar97._12_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar39,auVar97,1);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar97 = vdivps_avx(auVar98,(undefined1  [16])aVar5);
      auVar99._8_4_ = 0x5d5e0b6b;
      auVar99._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar99._12_4_ = 0x5d5e0b6b;
      auVar39 = vblendvps_avx(auVar97,auVar99,auVar39);
      auVar80._0_4_ = auVar39._0_4_ * 0.99999964;
      auVar80._4_4_ = auVar39._4_4_ * 0.99999964;
      auVar80._8_4_ = auVar39._8_4_ * 0.99999964;
      auVar80._12_4_ = auVar39._12_4_ * 0.99999964;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar119 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar133 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      auVar64._0_4_ = auVar39._0_4_ * 1.0000004;
      auVar64._4_4_ = auVar39._4_4_ * 1.0000004;
      auVar64._8_4_ = auVar39._8_4_ * 1.0000004;
      auVar64._12_4_ = auVar39._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar140 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      auVar39 = vshufps_avx(auVar80,auVar80,0);
      auVar141 = ZEXT3264(CONCAT1616(auVar39,auVar39));
      auVar39 = vmovshdup_avx(auVar80);
      auVar97 = vshufps_avx(auVar80,auVar80,0x55);
      auVar143 = ZEXT3264(CONCAT1616(auVar97,auVar97));
      auVar97 = vshufpd_avx(auVar80,auVar80,1);
      auVar98 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar149 = ZEXT3264(CONCAT1616(auVar98,auVar98));
      auVar98 = vshufps_avx(auVar64,auVar64,0);
      auVar158 = ZEXT3264(CONCAT1616(auVar98,auVar98));
      auVar98 = vshufps_avx(auVar64,auVar64,0x55);
      auVar91 = ZEXT1664(auVar98);
      auVar165 = ZEXT3264(CONCAT1616(auVar98,auVar98));
      auVar98 = vshufps_avx(auVar64,auVar64,0xaa);
      auVar73 = ZEXT1664(auVar98);
      local_14d0 = (ulong)(auVar80._0_4_ < 0.0) << 5;
      auVar171 = ZEXT3264(CONCAT1616(auVar98,auVar98));
      uVar36 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
      uVar23 = (ulong)(auVar97._0_4_ < 0.0) << 5 | 0x80;
      uVar37 = local_14d0 ^ 0x20;
      auVar39 = vshufps_avx(auVar50,auVar50,0);
      auVar59 = ZEXT1664(auVar39);
      auVar114 = ZEXT3264(CONCAT1616(auVar39,auVar39));
      auVar39 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
      local_11f8._16_16_ = auVar39;
      local_11f8._0_16_ = auVar39;
      local_1458 = mm_lookupmask_ps._240_16_;
      local_1520 = context;
      do {
        uVar38 = local_14c8[-1];
        local_14c8 = local_14c8 + -1;
        while( true ) {
          local_1218 = auVar119._0_32_;
          local_1238 = auVar133._0_32_;
          local_1258 = auVar140._0_32_;
          if ((uVar38 & 8) != 0) break;
          uVar19 = uVar38 & 0xfffffffffffffff0;
          fVar147 = (ray->dir).field_0.m128[3];
          auVar46._4_4_ = fVar147;
          auVar46._0_4_ = fVar147;
          auVar46._8_4_ = fVar147;
          auVar46._12_4_ = fVar147;
          auVar46._16_4_ = fVar147;
          auVar46._20_4_ = fVar147;
          auVar46._24_4_ = fVar147;
          auVar46._28_4_ = fVar147;
          pfVar3 = (float *)(uVar19 + 0x100 + local_14d0);
          pfVar1 = (float *)(uVar19 + 0x40 + local_14d0);
          auVar58._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar58._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar58._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar58._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar58._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar58._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar58._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar58._28_4_ = auVar59._28_4_ + pfVar1[7];
          auVar58 = vsubps_avx(auVar58,local_1218);
          auVar12._4_4_ = auVar141._4_4_ * auVar58._4_4_;
          auVar12._0_4_ = auVar141._0_4_ * auVar58._0_4_;
          auVar12._8_4_ = auVar141._8_4_ * auVar58._8_4_;
          auVar12._12_4_ = auVar141._12_4_ * auVar58._12_4_;
          auVar12._16_4_ = auVar141._16_4_ * auVar58._16_4_;
          auVar12._20_4_ = auVar141._20_4_ * auVar58._20_4_;
          auVar12._24_4_ = auVar141._24_4_ * auVar58._24_4_;
          auVar12._28_4_ = auVar58._28_4_;
          auVar58 = vmaxps_avx(auVar114._0_32_,auVar12);
          pfVar3 = (float *)(uVar19 + 0x100 + uVar36);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar36);
          auVar71._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar71._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar71._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar71._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar71._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar71._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar71._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar71._28_4_ = auVar73._28_4_ + pfVar1[7];
          auVar12 = vsubps_avx(auVar71,local_1238);
          auVar14._4_4_ = auVar143._4_4_ * auVar12._4_4_;
          auVar14._0_4_ = auVar143._0_4_ * auVar12._0_4_;
          auVar14._8_4_ = auVar143._8_4_ * auVar12._8_4_;
          auVar14._12_4_ = auVar143._12_4_ * auVar12._12_4_;
          auVar14._16_4_ = auVar143._16_4_ * auVar12._16_4_;
          auVar14._20_4_ = auVar143._20_4_ * auVar12._20_4_;
          auVar14._24_4_ = auVar143._24_4_ * auVar12._24_4_;
          auVar14._28_4_ = auVar12._28_4_;
          pfVar3 = (float *)(uVar19 + 0x100 + uVar23);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar23);
          auVar89._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar89._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar89._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar89._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar89._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar89._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar89._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar89._28_4_ = auVar91._28_4_ + pfVar1[7];
          auVar71 = vsubps_avx(auVar89,local_1258);
          auVar15._4_4_ = auVar149._4_4_ * auVar71._4_4_;
          auVar15._0_4_ = auVar149._0_4_ * auVar71._0_4_;
          auVar15._8_4_ = auVar149._8_4_ * auVar71._8_4_;
          auVar15._12_4_ = auVar149._12_4_ * auVar71._12_4_;
          auVar15._16_4_ = auVar149._16_4_ * auVar71._16_4_;
          auVar15._20_4_ = auVar149._20_4_ * auVar71._20_4_;
          auVar15._24_4_ = auVar149._24_4_ * auVar71._24_4_;
          auVar15._28_4_ = auVar71._28_4_;
          auVar12 = vmaxps_avx(auVar14,auVar15);
          auVar58 = vmaxps_avx(auVar58,auVar12);
          pfVar3 = (float *)(uVar19 + 0x100 + uVar37);
          pfVar1 = (float *)(uVar19 + 0x40 + uVar37);
          auVar72._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar72._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar72._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar72._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar72._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar72._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar72._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar72._28_4_ = auVar12._28_4_ + pfVar1[7];
          auVar12 = vsubps_avx(auVar72,local_1218);
          auVar16._4_4_ = auVar158._4_4_ * auVar12._4_4_;
          auVar16._0_4_ = auVar158._0_4_ * auVar12._0_4_;
          auVar16._8_4_ = auVar158._8_4_ * auVar12._8_4_;
          auVar16._12_4_ = auVar158._12_4_ * auVar12._12_4_;
          auVar16._16_4_ = auVar158._16_4_ * auVar12._16_4_;
          auVar16._20_4_ = auVar158._20_4_ * auVar12._20_4_;
          auVar16._24_4_ = auVar158._24_4_ * auVar12._24_4_;
          auVar16._28_4_ = auVar12._28_4_;
          pfVar3 = (float *)(uVar19 + 0x100 + (uVar36 ^ 0x20));
          auVar12 = vminps_avx(local_11f8,auVar16);
          pfVar1 = (float *)(uVar19 + 0x40 + (uVar36 ^ 0x20));
          auVar90._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar90._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar90._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar90._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar90._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar90._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar90._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar90._28_4_ = auVar71._28_4_ + pfVar1[7];
          auVar71 = vsubps_avx(auVar90,local_1238);
          pfVar3 = (float *)(uVar19 + 0x100 + (uVar23 ^ 0x20));
          pfVar1 = (float *)(uVar19 + 0x40 + (uVar23 ^ 0x20));
          auVar103._0_4_ = fVar147 * *pfVar3 + *pfVar1;
          auVar103._4_4_ = fVar147 * pfVar3[1] + pfVar1[1];
          auVar103._8_4_ = fVar147 * pfVar3[2] + pfVar1[2];
          auVar103._12_4_ = fVar147 * pfVar3[3] + pfVar1[3];
          auVar103._16_4_ = fVar147 * pfVar3[4] + pfVar1[4];
          auVar103._20_4_ = fVar147 * pfVar3[5] + pfVar1[5];
          auVar103._24_4_ = fVar147 * pfVar3[6] + pfVar1[6];
          auVar103._28_4_ = local_11f8._28_4_ + pfVar1[7];
          auVar17._4_4_ = auVar165._4_4_ * auVar71._4_4_;
          auVar17._0_4_ = auVar165._0_4_ * auVar71._0_4_;
          auVar17._8_4_ = auVar165._8_4_ * auVar71._8_4_;
          auVar17._12_4_ = auVar165._12_4_ * auVar71._12_4_;
          auVar17._16_4_ = auVar165._16_4_ * auVar71._16_4_;
          auVar17._20_4_ = auVar165._20_4_ * auVar71._20_4_;
          auVar17._24_4_ = auVar165._24_4_ * auVar71._24_4_;
          auVar17._28_4_ = auVar71._28_4_;
          auVar71 = vsubps_avx(auVar103,local_1258);
          auVar18._4_4_ = auVar171._4_4_ * auVar71._4_4_;
          auVar18._0_4_ = auVar171._0_4_ * auVar71._0_4_;
          auVar18._8_4_ = auVar171._8_4_ * auVar71._8_4_;
          auVar18._12_4_ = auVar171._12_4_ * auVar71._12_4_;
          auVar18._16_4_ = auVar171._16_4_ * auVar71._16_4_;
          auVar18._20_4_ = auVar171._20_4_ * auVar71._20_4_;
          auVar18._24_4_ = auVar171._24_4_ * auVar71._24_4_;
          auVar18._28_4_ = auVar71._28_4_;
          auVar71 = vminps_avx(auVar17,auVar18);
          auVar91 = ZEXT3264(auVar71);
          auVar12 = vminps_avx(auVar12,auVar71);
          auVar58 = vcmpps_avx(auVar58,auVar12,2);
          auVar59 = ZEXT3264(auVar58);
          if (((uint)uVar38 & 7) == 6) {
            auVar12 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar46,2);
            auVar71 = vcmpps_avx(auVar46,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
            auVar71 = vandps_avx(auVar12,auVar71);
            auVar58 = vandps_avx(auVar71,auVar58);
            auVar59 = ZEXT1664(auVar58._16_16_);
            auVar39 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          }
          else {
            auVar39 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          }
          auVar73 = ZEXT3264(auVar12);
          auVar39 = vpsllw_avx(auVar39,0xf);
          if ((((((((auVar39 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar39 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar39 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar39 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar39[0xf]) goto LAB_002e9514;
          auVar39 = vpacksswb_avx(auVar39,auVar39);
          bVar13 = SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar39 >> 0x17,0) & 1) << 2 | (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar39 >> 0x27,0) & 1) << 4 | (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar39 >> 0x37,0) & 1) << 6 | SUB161(auVar39 >> 0x3f,0) << 7;
          lVar7 = 0;
          if (bVar13 != 0) {
            for (; (bVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar38 = *(ulong *)(uVar19 + lVar7 * 8);
          uVar31 = bVar13 - 1 & (uint)bVar13;
          if (uVar31 != 0) {
            *local_14c8 = uVar38;
            local_14c8 = local_14c8 + 1;
            lVar7 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar38 = *(ulong *)(uVar19 + lVar7 * 8);
            uVar31 = uVar31 - 1 & uVar31;
            uVar20 = (ulong)uVar31;
            if (uVar31 != 0) {
              do {
                *local_14c8 = uVar38;
                local_14c8 = local_14c8 + 1;
                lVar7 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar38 = *(ulong *)(uVar19 + lVar7 * 8);
                uVar20 = uVar20 & uVar20 - 1;
              } while (uVar20 != 0);
            }
          }
        }
        local_14d8 = (ulong)((uint)uVar38 & 0xf) - 8;
        if (local_14d8 != 0) {
          uVar38 = uVar38 & 0xfffffffffffffff0;
          pSVar30 = local_1520->scene;
          local_14c0 = 0;
          local_1278 = auVar141._0_32_;
          local_1298 = auVar143._0_32_;
          local_12b8 = auVar149._0_32_;
          local_12d8 = auVar158._0_32_;
          local_12f8 = auVar165._0_32_;
          local_1318 = auVar171._0_32_;
          local_1338 = auVar114._0_32_;
          local_1528 = pSVar30;
          local_1578 = ray;
          do {
            lVar34 = local_14c0 * 0x50;
            pGVar6 = (pSVar30->geometries).items[*(uint *)(uVar38 + 0x30 + lVar34)].ptr;
            fVar147 = (pGVar6->time_range).lower;
            fVar147 = pGVar6->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar147) /
                      ((pGVar6->time_range).upper - fVar147));
            auVar39 = vroundss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),9);
            auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar65 = vmaxss_avx(auVar126._0_16_,auVar39);
            lVar21 = (long)(int)auVar65._0_4_ * 0x38;
            uVar35 = (ulong)*(uint *)(uVar38 + 4 + lVar34);
            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar21);
            lVar21 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar21);
            auVar39 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar38 + lVar34) * 4);
            uVar24 = (ulong)*(uint *)(uVar38 + 0x10 + lVar34);
            auVar97 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
            uVar25 = (ulong)*(uint *)(uVar38 + 0x20 + lVar34);
            auVar83 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
            auVar50 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
            uVar26 = (ulong)*(uint *)(uVar38 + 0x14 + lVar34);
            auVar98 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
            uVar27 = (ulong)*(uint *)(uVar38 + 0x24 + lVar34);
            auVar84 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
            uVar28 = (ulong)*(uint *)(uVar38 + 8 + lVar34);
            auVar64 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
            uVar19 = (ulong)*(uint *)(uVar38 + 0x18 + lVar34);
            auVar80 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
            uVar32 = (ulong)*(uint *)(uVar38 + 0x28 + lVar34);
            auVar99 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
            uVar33 = (ulong)*(uint *)(uVar38 + 0xc + lVar34);
            auVar40 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
            uVar20 = (ulong)*(uint *)(uVar38 + 0x1c + lVar34);
            auVar41 = *(undefined1 (*) [16])(lVar7 + uVar20 * 4);
            uVar22 = (ulong)*(uint *)(uVar38 + 0x2c + lVar34);
            auVar42 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
            auVar51 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar38 + lVar34) * 4);
            auVar52 = *(undefined1 (*) [16])(lVar21 + uVar24 * 4);
            fVar147 = fVar147 - auVar65._0_4_;
            auVar65 = vunpcklps_avx(auVar39,auVar64);
            auVar64 = vunpckhps_avx(auVar39,auVar64);
            auVar66 = vunpcklps_avx(auVar50,auVar40);
            auVar50 = vunpckhps_avx(auVar50,auVar40);
            auVar39 = *(undefined1 (*) [16])(lVar21 + uVar35 * 4);
            auVar81 = vunpcklps_avx(auVar64,auVar50);
            auVar82 = vunpcklps_avx(auVar65,auVar66);
            auVar64 = vunpckhps_avx(auVar65,auVar66);
            auVar40 = vunpcklps_avx(auVar97,auVar80);
            auVar50 = vunpckhps_avx(auVar97,auVar80);
            auVar80 = vunpcklps_avx(auVar98,auVar41);
            auVar98 = vunpckhps_avx(auVar98,auVar41);
            auVar97 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
            auVar41 = vunpcklps_avx(auVar50,auVar98);
            auVar65 = vunpcklps_avx(auVar40,auVar80);
            auVar98 = vunpckhps_avx(auVar40,auVar80);
            auVar40 = vunpcklps_avx(auVar83,auVar99);
            auVar80 = vunpckhps_avx(auVar83,auVar99);
            auVar66 = vunpcklps_avx(auVar84,auVar42);
            auVar99 = vunpckhps_avx(auVar84,auVar42);
            auVar50 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
            auVar42 = vunpcklps_avx(auVar80,auVar99);
            auVar83 = vunpcklps_avx(auVar40,auVar66);
            auVar80 = vunpckhps_avx(auVar40,auVar66);
            auVar99 = vunpcklps_avx(auVar51,auVar97);
            auVar97 = vunpckhps_avx(auVar51,auVar97);
            auVar40 = vunpcklps_avx(auVar39,auVar50);
            auVar50 = vunpckhps_avx(auVar39,auVar50);
            auVar39 = *(undefined1 (*) [16])(lVar21 + uVar19 * 4);
            auVar51 = vunpcklps_avx(auVar97,auVar50);
            auVar66 = vunpcklps_avx(auVar99,auVar40);
            auVar50 = vunpckhps_avx(auVar99,auVar40);
            auVar40 = vunpcklps_avx(auVar52,auVar39);
            auVar99 = vunpckhps_avx(auVar52,auVar39);
            auVar39 = *(undefined1 (*) [16])(lVar21 + uVar26 * 4);
            auVar97 = *(undefined1 (*) [16])(lVar21 + uVar20 * 4);
            auVar52 = vunpcklps_avx(auVar39,auVar97);
            auVar39 = vunpckhps_avx(auVar39,auVar97);
            auVar84 = vunpcklps_avx(auVar99,auVar39);
            auVar101 = vunpcklps_avx(auVar40,auVar52);
            auVar99 = vunpckhps_avx(auVar40,auVar52);
            auVar39 = *(undefined1 (*) [16])(lVar21 + uVar25 * 4);
            auVar97 = *(undefined1 (*) [16])(lVar21 + uVar32 * 4);
            auVar52 = vunpcklps_avx(auVar39,auVar97);
            auVar40 = vunpckhps_avx(auVar39,auVar97);
            auVar39 = *(undefined1 (*) [16])(lVar21 + uVar27 * 4);
            auVar97 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
            auVar100 = vunpcklps_avx(auVar39,auVar97);
            auVar39 = vunpckhps_avx(auVar39,auVar97);
            auVar102 = vunpcklps_avx(auVar40,auVar39);
            auVar111 = vunpcklps_avx(auVar52,auVar100);
            auVar40 = vunpckhps_avx(auVar52,auVar100);
            auVar39 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
            auVar97 = vshufps_avx(ZEXT416((uint)(1.0 - fVar147)),ZEXT416((uint)(1.0 - fVar147)),0);
            fVar74 = auVar39._0_4_;
            fVar75 = auVar39._4_4_;
            fVar78 = auVar39._8_4_;
            fVar174 = auVar39._12_4_;
            fVar147 = auVar97._0_4_;
            fVar150 = auVar97._4_4_;
            fVar152 = auVar97._8_4_;
            fVar154 = auVar97._12_4_;
            auVar115._0_4_ = fVar147 * auVar82._0_4_ + fVar74 * auVar66._0_4_;
            auVar115._4_4_ = fVar150 * auVar82._4_4_ + fVar75 * auVar66._4_4_;
            auVar115._8_4_ = fVar152 * auVar82._8_4_ + fVar78 * auVar66._8_4_;
            auVar115._12_4_ = fVar154 * auVar82._12_4_ + fVar174 * auVar66._12_4_;
            auVar120._0_4_ = fVar147 * auVar64._0_4_ + fVar74 * auVar50._0_4_;
            auVar120._4_4_ = fVar150 * auVar64._4_4_ + fVar75 * auVar50._4_4_;
            auVar120._8_4_ = fVar152 * auVar64._8_4_ + fVar78 * auVar50._8_4_;
            auVar120._12_4_ = fVar154 * auVar64._12_4_ + fVar174 * auVar50._12_4_;
            local_1518._0_4_ = auVar81._0_4_;
            local_1518._4_4_ = auVar81._4_4_;
            fStack_1510 = auVar81._8_4_;
            fStack_150c = auVar81._12_4_;
            auVar100._0_4_ = fVar147 * (float)local_1518._0_4_ + fVar74 * auVar51._0_4_;
            auVar100._4_4_ = fVar150 * (float)local_1518._4_4_ + fVar75 * auVar51._4_4_;
            auVar100._8_4_ = fVar152 * fStack_1510 + fVar78 * auVar51._8_4_;
            auVar100._12_4_ = fVar154 * fStack_150c + fVar174 * auVar51._12_4_;
            auVar128._0_4_ = fVar147 * auVar65._0_4_ + fVar74 * auVar101._0_4_;
            auVar128._4_4_ = fVar150 * auVar65._4_4_ + fVar75 * auVar101._4_4_;
            auVar128._8_4_ = fVar152 * auVar65._8_4_ + fVar78 * auVar101._8_4_;
            auVar128._12_4_ = fVar154 * auVar65._12_4_ + fVar174 * auVar101._12_4_;
            auVar110._0_4_ = fVar147 * auVar98._0_4_ + fVar74 * auVar99._0_4_;
            auVar110._4_4_ = fVar150 * auVar98._4_4_ + fVar75 * auVar99._4_4_;
            auVar110._8_4_ = fVar152 * auVar98._8_4_ + fVar78 * auVar99._8_4_;
            auVar110._12_4_ = fVar154 * auVar98._12_4_ + fVar174 * auVar99._12_4_;
            puVar2 = (undefined8 *)(uVar38 + 0x30 + lVar34);
            local_13f8 = *puVar2;
            uStack_13f0 = puVar2[1];
            puVar2 = (undefined8 *)(uVar38 + 0x40 + lVar34);
            local_1538._0_4_ = auVar41._0_4_;
            local_1538._4_4_ = auVar41._4_4_;
            fStack_1530 = auVar41._8_4_;
            fStack_152c = auVar41._12_4_;
            auVar50._0_4_ = fVar147 * (float)local_1538._0_4_ + fVar74 * auVar84._0_4_;
            auVar50._4_4_ = fVar150 * (float)local_1538._4_4_ + fVar75 * auVar84._4_4_;
            auVar50._8_4_ = fVar152 * fStack_1530 + fVar78 * auVar84._8_4_;
            auVar50._12_4_ = fVar154 * fStack_152c + fVar174 * auVar84._12_4_;
            local_14e8._0_4_ = auVar83._0_4_;
            local_14e8._4_4_ = auVar83._4_4_;
            fStack_14e0 = auVar83._8_4_;
            fStack_14dc = auVar83._12_4_;
            auVar65._0_4_ = fVar147 * (float)local_14e8._0_4_ + fVar74 * auVar111._0_4_;
            auVar65._4_4_ = fVar150 * (float)local_14e8._4_4_ + fVar75 * auVar111._4_4_;
            auVar65._8_4_ = fVar152 * fStack_14e0 + fVar78 * auVar111._8_4_;
            auVar65._12_4_ = fVar154 * fStack_14dc + fVar174 * auVar111._12_4_;
            local_1558._0_4_ = auVar80._0_4_;
            local_1558._4_4_ = auVar80._4_4_;
            fStack_1550 = auVar80._8_4_;
            fStack_154c = auVar80._12_4_;
            auVar170._0_4_ = fVar147 * (float)local_1558._0_4_ + fVar74 * auVar40._0_4_;
            auVar170._4_4_ = fVar150 * (float)local_1558._4_4_ + fVar75 * auVar40._4_4_;
            auVar170._8_4_ = fVar152 * fStack_1550 + fVar78 * auVar40._8_4_;
            auVar170._12_4_ = fVar154 * fStack_154c + fVar174 * auVar40._12_4_;
            local_1548._0_4_ = auVar42._0_4_;
            local_1548._4_4_ = auVar42._4_4_;
            fStack_1540 = auVar42._8_4_;
            fStack_153c = auVar42._12_4_;
            auVar137._0_4_ = fVar74 * auVar102._0_4_ + fVar147 * (float)local_1548._0_4_;
            auVar137._4_4_ = fVar75 * auVar102._4_4_ + fVar150 * (float)local_1548._4_4_;
            auVar137._8_4_ = fVar78 * auVar102._8_4_ + fVar152 * fStack_1540;
            auVar137._12_4_ = fVar174 * auVar102._12_4_ + fVar154 * fStack_153c;
            local_1408 = *puVar2;
            uStack_1400 = puVar2[1];
            uVar4 = *(undefined4 *)&(local_1578->org).field_0;
            auVar40._4_4_ = uVar4;
            auVar40._0_4_ = uVar4;
            auVar40._8_4_ = uVar4;
            auVar40._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(local_1578->org).field_0 + 4);
            auVar157._4_4_ = uVar4;
            auVar157._0_4_ = uVar4;
            auVar157._8_4_ = uVar4;
            auVar157._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(local_1578->org).field_0 + 8);
            auVar163._4_4_ = uVar4;
            auVar163._0_4_ = uVar4;
            auVar163._8_4_ = uVar4;
            auVar163._12_4_ = uVar4;
            _local_1538 = vsubps_avx(auVar115,auVar40);
            _local_1548 = vsubps_avx(auVar120,auVar157);
            _local_1558 = vsubps_avx(auVar100,auVar163);
            auVar39 = vsubps_avx(auVar128,auVar40);
            auVar97 = vsubps_avx(auVar110,auVar157);
            auVar50 = vsubps_avx(auVar50,auVar163);
            auVar98 = vsubps_avx(auVar65,auVar40);
            auVar64 = vsubps_avx(auVar170,auVar157);
            auVar80 = vsubps_avx(auVar137,auVar163);
            _local_14e8 = vsubps_avx(auVar98,_local_1538);
            local_14f8 = vsubps_avx(auVar64,_local_1548);
            local_1508 = vsubps_avx(auVar80,_local_1558);
            fVar147 = local_1548._0_4_;
            fVar49 = auVar64._0_4_ + fVar147;
            fVar154 = local_1548._4_4_;
            fVar60 = auVar64._4_4_ + fVar154;
            fVar78 = local_1548._8_4_;
            fVar61 = auVar64._8_4_ + fVar78;
            fVar9 = local_1548._12_4_;
            fVar62 = auVar64._12_4_ + fVar9;
            fVar150 = local_1558._0_4_;
            fVar95 = auVar80._0_4_ + fVar150;
            fVar74 = local_1558._4_4_;
            fVar104 = auVar80._4_4_ + fVar74;
            fVar174 = local_1558._8_4_;
            fVar106 = auVar80._8_4_ + fVar174;
            fVar10 = local_1558._12_4_;
            fVar108 = auVar80._12_4_ + fVar10;
            fVar63 = local_1508._0_4_;
            auVar129._0_4_ = fVar63 * fVar49;
            fVar77 = local_1508._4_4_;
            auVar129._4_4_ = fVar77 * fVar60;
            fVar47 = local_1508._8_4_;
            auVar129._8_4_ = fVar47 * fVar61;
            fVar48 = local_1508._12_4_;
            auVar129._12_4_ = fVar48 * fVar62;
            fVar169 = local_14f8._0_4_;
            auVar138._0_4_ = fVar169 * fVar95;
            fVar172 = local_14f8._4_4_;
            auVar138._4_4_ = fVar172 * fVar104;
            fVar173 = local_14f8._8_4_;
            auVar138._8_4_ = fVar173 * fVar106;
            fVar175 = local_14f8._12_4_;
            auVar138._12_4_ = fVar175 * fVar108;
            auVar99 = vsubps_avx(auVar138,auVar129);
            fVar152 = local_1538._0_4_;
            fVar127 = auVar98._0_4_ + fVar152;
            fVar75 = local_1538._4_4_;
            fVar134 = auVar98._4_4_ + fVar75;
            fVar8 = local_1538._8_4_;
            fVar135 = auVar98._8_4_ + fVar8;
            fVar11 = local_1538._12_4_;
            fVar136 = auVar98._12_4_ + fVar11;
            fVar162 = local_14e8._0_4_;
            auVar101._0_4_ = fVar162 * fVar95;
            fVar166 = local_14e8._4_4_;
            auVar101._4_4_ = fVar166 * fVar104;
            fVar167 = local_14e8._8_4_;
            auVar101._8_4_ = fVar167 * fVar106;
            fVar168 = local_14e8._12_4_;
            auVar101._12_4_ = fVar168 * fVar108;
            auVar139._0_4_ = fVar127 * fVar63;
            auVar139._4_4_ = fVar134 * fVar77;
            auVar139._8_4_ = fVar135 * fVar47;
            auVar139._12_4_ = fVar136 * fVar48;
            auVar40 = vsubps_avx(auVar139,auVar101);
            auVar130._0_4_ = fVar169 * fVar127;
            auVar130._4_4_ = fVar172 * fVar134;
            auVar130._8_4_ = fVar173 * fVar135;
            auVar130._12_4_ = fVar175 * fVar136;
            auVar41._0_4_ = fVar162 * fVar49;
            auVar41._4_4_ = fVar166 * fVar60;
            auVar41._8_4_ = fVar167 * fVar61;
            auVar41._12_4_ = fVar168 * fVar62;
            auVar41 = vsubps_avx(auVar41,auVar130);
            fStack_1594 = (local_1578->dir).field_0.m128[2];
            local_1588._4_4_ = (local_1578->dir).field_0.m128[1];
            fStack_1560 = (local_1578->dir).field_0.m128[0];
            local_1568 = CONCAT44(fStack_1560,fStack_1560);
            fStack_155c = fStack_1560;
            local_15a8._0_4_ =
                 auVar99._0_4_ * fStack_1560 +
                 local_1588._4_4_ * auVar40._0_4_ + fStack_1594 * auVar41._0_4_;
            local_15a8._4_4_ =
                 auVar99._4_4_ * fStack_1560 +
                 local_1588._4_4_ * auVar40._4_4_ + fStack_1594 * auVar41._4_4_;
            local_15a8._8_4_ =
                 auVar99._8_4_ * fStack_1560 +
                 local_1588._4_4_ * auVar40._8_4_ + fStack_1594 * auVar41._8_4_;
            local_15a8._12_4_ =
                 auVar99._12_4_ * fStack_1560 +
                 local_1588._4_4_ * auVar40._12_4_ + fStack_1594 * auVar41._12_4_;
            _local_1518 = vsubps_avx(_local_1548,auVar97);
            local_1428 = vsubps_avx(_local_1558,auVar50);
            fVar60 = fVar147 + auVar97._0_4_;
            fVar62 = fVar154 + auVar97._4_4_;
            fVar104 = fVar78 + auVar97._8_4_;
            fVar108 = fVar9 + auVar97._12_4_;
            fVar127 = fVar150 + auVar50._0_4_;
            fVar134 = fVar74 + auVar50._4_4_;
            fVar135 = fVar174 + auVar50._8_4_;
            fVar136 = fVar10 + auVar50._12_4_;
            fVar49 = local_1428._0_4_;
            auVar164._0_4_ = fVar49 * fVar60;
            fVar61 = local_1428._4_4_;
            auVar164._4_4_ = fVar61 * fVar62;
            fVar95 = local_1428._8_4_;
            auVar164._8_4_ = fVar95 * fVar104;
            fVar106 = local_1428._12_4_;
            auVar164._12_4_ = fVar106 * fVar108;
            fVar156 = local_1518._0_4_;
            auVar81._0_4_ = fVar156 * fVar127;
            fVar159 = local_1518._4_4_;
            auVar81._4_4_ = fVar159 * fVar134;
            fVar160 = local_1518._8_4_;
            auVar81._8_4_ = fVar160 * fVar135;
            fVar161 = local_1518._12_4_;
            auVar81._12_4_ = fVar161 * fVar136;
            auVar99 = vsubps_avx(auVar81,auVar164);
            local_1418 = vsubps_avx(_local_1538,auVar39);
            fVar142 = local_1418._0_4_;
            auVar102._0_4_ = fVar142 * fVar127;
            fVar144 = local_1418._4_4_;
            auVar102._4_4_ = fVar144 * fVar134;
            fVar145 = local_1418._8_4_;
            auVar102._8_4_ = fVar145 * fVar135;
            fVar146 = local_1418._12_4_;
            auVar102._12_4_ = fVar146 * fVar136;
            fVar127 = fVar152 + auVar39._0_4_;
            fVar134 = fVar75 + auVar39._4_4_;
            fVar135 = fVar8 + auVar39._8_4_;
            fVar136 = fVar11 + auVar39._12_4_;
            auVar131._0_4_ = fVar49 * fVar127;
            auVar131._4_4_ = fVar61 * fVar134;
            auVar131._8_4_ = fVar95 * fVar135;
            auVar131._12_4_ = fVar106 * fVar136;
            auVar40 = vsubps_avx(auVar131,auVar102);
            auVar121._0_4_ = fVar156 * fVar127;
            auVar121._4_4_ = fVar159 * fVar134;
            auVar121._8_4_ = fVar160 * fVar135;
            auVar121._12_4_ = fVar161 * fVar136;
            auVar42._0_4_ = fVar142 * fVar60;
            auVar42._4_4_ = fVar144 * fVar62;
            auVar42._8_4_ = fVar145 * fVar104;
            auVar42._12_4_ = fVar146 * fVar108;
            auVar41 = vsubps_avx(auVar42,auVar121);
            local_13d8._0_4_ =
                 fStack_1560 * auVar99._0_4_ +
                 local_1588._4_4_ * auVar40._0_4_ + fStack_1594 * auVar41._0_4_;
            local_13d8._4_4_ =
                 fStack_1560 * auVar99._4_4_ +
                 local_1588._4_4_ * auVar40._4_4_ + fStack_1594 * auVar41._4_4_;
            local_13d8._8_4_ =
                 fStack_1560 * auVar99._8_4_ +
                 local_1588._4_4_ * auVar40._8_4_ + fStack_1594 * auVar41._8_4_;
            local_13d8._12_4_ =
                 fStack_1560 * auVar99._12_4_ +
                 local_1588._4_4_ * auVar40._12_4_ + fStack_1594 * auVar41._12_4_;
            auVar99 = vsubps_avx(auVar39,auVar98);
            fVar79 = auVar39._0_4_ + auVar98._0_4_;
            fVar92 = auVar39._4_4_ + auVar98._4_4_;
            fVar93 = auVar39._8_4_ + auVar98._8_4_;
            fVar94 = auVar39._12_4_ + auVar98._12_4_;
            auVar39 = vsubps_avx(auVar97,auVar64);
            fVar134 = auVar97._0_4_ + auVar64._0_4_;
            fVar135 = auVar97._4_4_ + auVar64._4_4_;
            fVar136 = auVar97._8_4_ + auVar64._8_4_;
            fVar76 = auVar97._12_4_ + auVar64._12_4_;
            auVar97 = vsubps_avx(auVar50,auVar80);
            fVar62 = auVar50._0_4_ + auVar80._0_4_;
            fVar104 = auVar50._4_4_ + auVar80._4_4_;
            fVar108 = auVar50._8_4_ + auVar80._8_4_;
            fVar127 = auVar50._12_4_ + auVar80._12_4_;
            fVar96 = auVar97._0_4_;
            auVar111._0_4_ = fVar96 * fVar134;
            fVar105 = auVar97._4_4_;
            auVar111._4_4_ = fVar105 * fVar135;
            fVar107 = auVar97._8_4_;
            auVar111._8_4_ = fVar107 * fVar136;
            fVar109 = auVar97._12_4_;
            auVar111._12_4_ = fVar109 * fVar76;
            fVar148 = auVar39._0_4_;
            auVar122._0_4_ = fVar148 * fVar62;
            fVar151 = auVar39._4_4_;
            auVar122._4_4_ = fVar151 * fVar104;
            fVar153 = auVar39._8_4_;
            auVar122._8_4_ = fVar153 * fVar108;
            fVar155 = auVar39._12_4_;
            auVar122._12_4_ = fVar155 * fVar127;
            auVar39 = vsubps_avx(auVar122,auVar111);
            fVar60 = auVar99._0_4_;
            auVar51._0_4_ = fVar60 * fVar62;
            fVar62 = auVar99._4_4_;
            auVar51._4_4_ = fVar62 * fVar104;
            fVar104 = auVar99._8_4_;
            auVar51._8_4_ = fVar104 * fVar108;
            fVar108 = auVar99._12_4_;
            auVar51._12_4_ = fVar108 * fVar127;
            auVar123._0_4_ = fVar96 * fVar79;
            auVar123._4_4_ = fVar105 * fVar92;
            auVar123._8_4_ = fVar107 * fVar93;
            auVar123._12_4_ = fVar109 * fVar94;
            auVar97 = vsubps_avx(auVar123,auVar51);
            auVar82._0_4_ = fVar148 * fVar79;
            auVar82._4_4_ = fVar151 * fVar92;
            auVar82._8_4_ = fVar153 * fVar93;
            auVar82._12_4_ = fVar155 * fVar94;
            auVar66._0_4_ = fVar60 * fVar134;
            auVar66._4_4_ = fVar62 * fVar135;
            auVar66._8_4_ = fVar104 * fVar136;
            auVar66._12_4_ = fVar108 * fVar76;
            auVar50 = vsubps_avx(auVar66,auVar82);
            local_1598 = fStack_1594;
            fStack_1590 = fStack_1594;
            fStack_158c = fStack_1594;
            local_1588._0_4_ = local_1588._4_4_;
            fStack_1580 = local_1588._4_4_;
            fStack_157c = local_1588._4_4_;
            auVar52._0_4_ =
                 fStack_1560 * auVar39._0_4_ +
                 local_1588._4_4_ * auVar97._0_4_ + fStack_1594 * auVar50._0_4_;
            auVar52._4_4_ =
                 fStack_1560 * auVar39._4_4_ +
                 local_1588._4_4_ * auVar97._4_4_ + fStack_1594 * auVar50._4_4_;
            auVar52._8_4_ =
                 fStack_1560 * auVar39._8_4_ +
                 local_1588._4_4_ * auVar97._8_4_ + fStack_1594 * auVar50._8_4_;
            auVar52._12_4_ =
                 fStack_1560 * auVar39._12_4_ +
                 local_1588._4_4_ * auVar97._12_4_ + fStack_1594 * auVar50._12_4_;
            local_13c8._0_4_ = auVar52._0_4_ + local_15a8._0_4_ + local_13d8._0_4_;
            local_13c8._4_4_ = auVar52._4_4_ + local_15a8._4_4_ + local_13d8._4_4_;
            local_13c8._8_4_ = auVar52._8_4_ + local_15a8._8_4_ + local_13d8._8_4_;
            local_13c8._12_4_ = auVar52._12_4_ + local_15a8._12_4_ + local_13d8._12_4_;
            auVar39 = vminps_avx(local_15a8,local_13d8);
            auVar39 = vminps_avx(auVar39,auVar52);
            auVar83._8_4_ = 0x7fffffff;
            auVar83._0_8_ = 0x7fffffff7fffffff;
            auVar83._12_4_ = 0x7fffffff;
            local_1438 = vandps_avx(local_13c8,auVar83);
            auVar84._0_4_ = local_1438._0_4_ * 1.1920929e-07;
            auVar84._4_4_ = local_1438._4_4_ * 1.1920929e-07;
            auVar84._8_4_ = local_1438._8_4_ * 1.1920929e-07;
            auVar84._12_4_ = local_1438._12_4_ * 1.1920929e-07;
            auVar91 = ZEXT1664(auVar84);
            uVar19 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
            auVar112._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar112._8_4_ = -auVar84._8_4_;
            auVar112._12_4_ = -auVar84._12_4_;
            auVar39 = vcmpps_avx(auVar39,auVar112,5);
            auVar73 = ZEXT1664(auVar39);
            auVar97 = vmaxps_avx(local_15a8,local_13d8);
            auVar97 = vmaxps_avx(auVar97,auVar52);
            auVar97 = vcmpps_avx(auVar97,auVar84,2);
            local_1448 = vorps_avx(auVar39,auVar97);
            auVar59 = ZEXT1664(local_1448);
            local_15a9 = 0;
            auVar39 = local_1458 & local_1448;
            ray = local_1578;
            pSVar30 = local_1528;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              auVar53._0_4_ = fVar156 * fVar63;
              auVar53._4_4_ = fVar159 * fVar77;
              auVar53._8_4_ = fVar160 * fVar47;
              auVar53._12_4_ = fVar161 * fVar48;
              auVar67._0_4_ = fVar169 * fVar49;
              auVar67._4_4_ = fVar172 * fVar61;
              auVar67._8_4_ = fVar173 * fVar95;
              auVar67._12_4_ = fVar175 * fVar106;
              auVar50 = vsubps_avx(auVar67,auVar53);
              auVar85._0_4_ = fVar49 * fVar148;
              auVar85._4_4_ = fVar61 * fVar151;
              auVar85._8_4_ = fVar95 * fVar153;
              auVar85._12_4_ = fVar106 * fVar155;
              auVar113._0_4_ = fVar156 * fVar96;
              auVar113._4_4_ = fVar159 * fVar105;
              auVar113._8_4_ = fVar160 * fVar107;
              auVar113._12_4_ = fVar161 * fVar109;
              auVar98 = vsubps_avx(auVar113,auVar85);
              auVar39 = vandps_avx(auVar83,auVar53);
              auVar97 = vandps_avx(auVar83,auVar85);
              auVar39 = vcmpps_avx(auVar39,auVar97,1);
              local_1368 = vblendvps_avx(auVar98,auVar50,auVar39);
              auVar54._0_4_ = fVar142 * fVar96;
              auVar54._4_4_ = fVar144 * fVar105;
              auVar54._8_4_ = fVar145 * fVar107;
              auVar54._12_4_ = fVar146 * fVar109;
              auVar68._0_4_ = fVar142 * fVar63;
              auVar68._4_4_ = fVar144 * fVar77;
              auVar68._8_4_ = fVar145 * fVar47;
              auVar68._12_4_ = fVar146 * fVar48;
              auVar86._0_4_ = fVar49 * fVar162;
              auVar86._4_4_ = fVar61 * fVar166;
              auVar86._8_4_ = fVar95 * fVar167;
              auVar86._12_4_ = fVar106 * fVar168;
              auVar50 = vsubps_avx(auVar68,auVar86);
              auVar116._0_4_ = fVar49 * fVar60;
              auVar116._4_4_ = fVar61 * fVar62;
              auVar116._8_4_ = fVar95 * fVar104;
              auVar116._12_4_ = fVar106 * fVar108;
              auVar98 = vsubps_avx(auVar116,auVar54);
              auVar39 = vandps_avx(auVar83,auVar86);
              auVar97 = vandps_avx(auVar83,auVar54);
              auVar39 = vcmpps_avx(auVar39,auVar97,1);
              local_1358 = vblendvps_avx(auVar98,auVar50,auVar39);
              auVar59 = ZEXT1664(local_1358);
              auVar43._0_4_ = fVar156 * fVar60;
              auVar43._4_4_ = fVar159 * fVar62;
              auVar43._8_4_ = fVar160 * fVar104;
              auVar43._12_4_ = fVar161 * fVar108;
              auVar69._0_4_ = fVar156 * fVar162;
              auVar69._4_4_ = fVar159 * fVar166;
              auVar69._8_4_ = fVar160 * fVar167;
              auVar69._12_4_ = fVar161 * fVar168;
              auVar87._0_4_ = fVar169 * fVar142;
              auVar87._4_4_ = fVar172 * fVar144;
              auVar87._8_4_ = fVar173 * fVar145;
              auVar87._12_4_ = fVar175 * fVar146;
              auVar117._0_4_ = fVar142 * fVar148;
              auVar117._4_4_ = fVar144 * fVar151;
              auVar117._8_4_ = fVar145 * fVar153;
              auVar117._12_4_ = fVar146 * fVar155;
              auVar50 = vsubps_avx(auVar69,auVar87);
              auVar98 = vsubps_avx(auVar117,auVar43);
              auVar39 = vandps_avx(auVar83,auVar87);
              auVar97 = vandps_avx(auVar83,auVar43);
              auVar39 = vcmpps_avx(auVar39,auVar97,1);
              local_1348 = vblendvps_avx(auVar98,auVar50,auVar39);
              fVar63 = local_1368._0_4_ * fStack_1560 +
                       local_1358._0_4_ * local_1588._4_4_ + local_1348._0_4_ * fStack_1594;
              fVar49 = local_1368._4_4_ * fStack_1560 +
                       local_1358._4_4_ * local_1588._4_4_ + local_1348._4_4_ * fStack_1594;
              fVar60 = local_1368._8_4_ * fStack_1560 +
                       local_1358._8_4_ * local_1588._4_4_ + local_1348._8_4_ * fStack_1594;
              fVar77 = local_1368._12_4_ * fStack_1560 +
                       local_1358._12_4_ * local_1588._4_4_ + local_1348._12_4_ * fStack_1594;
              auVar88._0_4_ = fVar63 + fVar63;
              auVar88._4_4_ = fVar49 + fVar49;
              auVar88._8_4_ = fVar60 + fVar60;
              auVar88._12_4_ = fVar77 + fVar77;
              fVar63 = local_1368._0_4_ * fVar152 +
                       local_1358._0_4_ * fVar147 + local_1348._0_4_ * fVar150;
              fVar74 = local_1368._4_4_ * fVar75 +
                       local_1358._4_4_ * fVar154 + local_1348._4_4_ * fVar74;
              fVar75 = local_1368._8_4_ * fVar8 +
                       local_1358._8_4_ * fVar78 + local_1348._8_4_ * fVar174;
              fVar78 = local_1368._12_4_ * fVar11 +
                       local_1358._12_4_ * fVar9 + local_1348._12_4_ * fVar10;
              auVar39 = vrcpps_avx(auVar88);
              fVar147 = auVar39._0_4_;
              auVar124._0_4_ = auVar88._0_4_ * fVar147;
              fVar150 = auVar39._4_4_;
              auVar124._4_4_ = auVar88._4_4_ * fVar150;
              fVar152 = auVar39._8_4_;
              auVar124._8_4_ = auVar88._8_4_ * fVar152;
              fVar154 = auVar39._12_4_;
              auVar124._12_4_ = auVar88._12_4_ * fVar154;
              auVar132._8_4_ = 0x3f800000;
              auVar132._0_8_ = 0x3f8000003f800000;
              auVar132._12_4_ = 0x3f800000;
              auVar39 = vsubps_avx(auVar132,auVar124);
              local_1378._0_4_ = (fVar63 + fVar63) * (fVar147 + fVar147 * auVar39._0_4_);
              local_1378._4_4_ = (fVar74 + fVar74) * (fVar150 + fVar150 * auVar39._4_4_);
              local_1378._8_4_ = (fVar75 + fVar75) * (fVar152 + fVar152 * auVar39._8_4_);
              local_1378._12_4_ = (fVar78 + fVar78) * (fVar154 + fVar154 * auVar39._12_4_);
              auVar73 = ZEXT1664(local_1378);
              uVar4 = *(undefined4 *)((long)&(local_1578->org).field_0 + 0xc);
              auVar118._4_4_ = uVar4;
              auVar118._0_4_ = uVar4;
              auVar118._8_4_ = uVar4;
              auVar118._12_4_ = uVar4;
              auVar39 = vcmpps_avx(auVar118,local_1378,2);
              fVar147 = local_1578->tfar;
              auVar125._4_4_ = fVar147;
              auVar125._0_4_ = fVar147;
              auVar125._8_4_ = fVar147;
              auVar125._12_4_ = fVar147;
              auVar97 = vcmpps_avx(local_1378,auVar125,2);
              auVar39 = vandps_avx(auVar39,auVar97);
              auVar97 = vcmpps_avx(auVar88,_DAT_01f7aa10,4);
              auVar39 = vandps_avx(auVar97,auVar39);
              auVar97 = vpand_avx(local_1448,local_1458);
              auVar39 = vpslld_avx(auVar39,0x1f);
              auVar39 = vpsrad_avx(auVar39,0x1f);
              local_13a8 = vpand_avx(auVar39,auVar97);
              auVar91 = ZEXT1664(local_13a8);
              uVar31 = vmovmskps_avx(local_13a8);
              if (uVar31 != 0) {
                local_13e8 = local_15a8;
                local_13b8 = &local_15a9;
                auVar39 = vrcpps_avx(local_13c8);
                fVar147 = auVar39._0_4_;
                auVar55._0_4_ = local_13c8._0_4_ * fVar147;
                fVar150 = auVar39._4_4_;
                auVar55._4_4_ = local_13c8._4_4_ * fVar150;
                fVar152 = auVar39._8_4_;
                auVar55._8_4_ = local_13c8._8_4_ * fVar152;
                fVar154 = auVar39._12_4_;
                auVar55._12_4_ = local_13c8._12_4_ * fVar154;
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = 0x3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar73 = ZEXT1664(auVar70);
                auVar39 = vsubps_avx(auVar70,auVar55);
                auVar44._0_4_ = fVar147 + fVar147 * auVar39._0_4_;
                auVar44._4_4_ = fVar150 + fVar150 * auVar39._4_4_;
                auVar44._8_4_ = fVar152 + fVar152 * auVar39._8_4_;
                auVar44._12_4_ = fVar154 + fVar154 * auVar39._12_4_;
                auVar56._8_4_ = 0x219392ef;
                auVar56._0_8_ = 0x219392ef219392ef;
                auVar56._12_4_ = 0x219392ef;
                auVar91 = ZEXT1664(local_1438);
                auVar39 = vcmpps_avx(local_1438,auVar56,5);
                auVar39 = vandps_avx(auVar39,auVar44);
                auVar57._0_4_ = local_15a8._0_4_ * auVar39._0_4_;
                auVar57._4_4_ = local_15a8._4_4_ * auVar39._4_4_;
                auVar57._8_4_ = local_15a8._8_4_ * auVar39._8_4_;
                auVar57._12_4_ = local_15a8._12_4_ * auVar39._12_4_;
                local_1398 = vminps_avx(auVar57,auVar70);
                auVar59 = ZEXT1664(local_1398);
                auVar45._0_4_ = local_13d8._0_4_ * auVar39._0_4_;
                auVar45._4_4_ = local_13d8._4_4_ * auVar39._4_4_;
                auVar45._8_4_ = local_13d8._8_4_ * auVar39._8_4_;
                auVar45._12_4_ = local_13d8._12_4_ * auVar39._12_4_;
                local_1388 = vminps_avx(auVar45,auVar70);
                local_1568 = (ulong)(uVar31 & 0xff);
                do {
                  uVar19 = 0;
                  if (local_1568 != 0) {
                    for (; (local_1568 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  local_14a0 = *(uint *)((long)&local_13f8 + uVar19 * 4);
                  pGVar6 = (pSVar30->geometries).items[local_14a0].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    local_1568 = local_1568 ^ 1L << (uVar19 & 0x3f);
                  }
                  else {
                    auVar29 = (undefined1  [8])local_1520->args;
                    if ((((RTCIntersectArguments *)auVar29)->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e9524;
                    local_1488.context = local_1520->user;
                    local_14b8 = *(uint *)(local_1368 + uVar19 * 4);
                    auVar39 = ZEXT416(local_14b8);
                    local_14b4 = *(uint *)(local_1358 + uVar19 * 4);
                    auVar97 = ZEXT416(local_14b4);
                    local_14b0 = *(undefined4 *)(local_1348 + uVar19 * 4);
                    local_14ac = *(undefined4 *)(local_1398 + uVar19 * 4);
                    local_14a8 = *(undefined4 *)(local_1388 + uVar19 * 4);
                    local_14a4 = *(undefined4 *)((long)&local_1408 + uVar19 * 4);
                    local_149c = (local_1488.context)->instID[0];
                    local_1498 = (local_1488.context)->instPrimID[0];
                    local_1598 = ray->tfar;
                    local_1588 = uVar19;
                    ray->tfar = *(float *)(local_1378 + uVar19 * 4);
                    local_156c = -1;
                    local_1488.valid = &local_156c;
                    local_1488.geometryUserPtr = pGVar6->userPtr;
                    local_1488.hit = (RTCHitN *)&local_14b8;
                    local_1488.N = 1;
                    local_15a8._0_8_ = pGVar6;
                    local_1488.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e9406:
                      ray = local_1578;
                      if ((((RTCIntersectArguments *)auVar29)->filter == (RTCFilterFunctionN)0x0) ||
                         (((((RTCIntersectArguments *)auVar29)->flags &
                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_15a8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002e9524:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      auVar73 = ZEXT1664(auVar39);
                      auVar91 = ZEXT1664(auVar97);
                      (*((RTCIntersectArguments *)auVar29)->filter)(&local_1488);
                      auVar59._8_56_ = extraout_var_00;
                      auVar59._0_8_ = extraout_XMM1_Qa_00;
                      ray = local_1578;
                      if (*local_1488.valid != 0) goto LAB_002e9524;
                    }
                    else {
                      local_1538 = auVar29;
                      auVar73 = ZEXT464(local_14b8);
                      auVar91 = ZEXT464(local_14b4);
                      (*pGVar6->occlusionFilterN)(&local_1488);
                      auVar97 = auVar91._0_16_;
                      auVar39 = auVar73._0_16_;
                      auVar59._8_56_ = extraout_var;
                      auVar59._0_8_ = extraout_XMM1_Qa;
                      auVar29 = local_1538;
                      if (*local_1488.valid != 0) goto LAB_002e9406;
                    }
                    local_1578->tfar = local_1598;
                    local_1568 = local_1568 ^ 1L << (local_1588 & 0x3f);
                    ray = local_1578;
                    pSVar30 = local_1528;
                  }
                } while (local_1568 != 0);
              }
            }
            local_14c0 = local_14c0 + 1;
            auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar119 = ZEXT3264(local_1218);
            auVar133 = ZEXT3264(local_1238);
            auVar140 = ZEXT3264(local_1258);
            auVar141 = ZEXT3264(local_1278);
            auVar143 = ZEXT3264(local_1298);
            auVar149 = ZEXT3264(local_12b8);
            auVar158 = ZEXT3264(local_12d8);
            auVar165 = ZEXT3264(local_12f8);
            auVar171 = ZEXT3264(local_1318);
            auVar114 = ZEXT3264(local_1338);
          } while (local_14c0 != local_14d8);
        }
LAB_002e9514:
      } while (local_14c8 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }